

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void * flatcc_builder_finalize_aligned_buffer(flatcc_builder_t *B,size_t *size_out)

{
  uint16_t uVar1;
  size_t sVar2;
  ulong alignment;
  ulong size_00;
  void *pvVar3;
  size_t size;
  size_t align;
  void *buffer;
  size_t *size_out_local;
  flatcc_builder_t *B_local;
  
  sVar2 = flatcc_builder_get_buffer_size(B);
  if (size_out != (size_t *)0x0) {
    *size_out = sVar2;
  }
  uVar1 = flatcc_builder_get_buffer_alignment(B);
  alignment = (ulong)uVar1;
  size_00 = (sVar2 + alignment) - 1 & (alignment - 1 ^ 0xffffffffffffffff);
  align = (size_t)__portable_aligned_alloc(alignment,size_00);
  if (((void *)align != (void *)0x0) &&
     (pvVar3 = flatcc_builder_copy_buffer(B,(void *)align,size_00), pvVar3 == (void *)0x0)) {
    free((void *)align);
    align = 0;
  }
  if ((align == 0) && (size_out != (size_t *)0x0)) {
    *size_out = 0;
  }
  return (void *)align;
}

Assistant:

void *flatcc_builder_finalize_aligned_buffer(flatcc_builder_t *B, size_t *size_out)
{
    void * buffer;
    size_t align;
    size_t size;

    size = flatcc_builder_get_buffer_size(B);

    if (size_out) {
        *size_out = size;
    }
    align = flatcc_builder_get_buffer_alignment(B);

    size = (size + align - 1) & ~(align - 1);
    buffer = FLATCC_BUILDER_ALIGNED_ALLOC(align, size);

    if (!buffer) {
        goto done;
    }
    if (!flatcc_builder_copy_buffer(B, buffer, size)) {
        FLATCC_BUILDER_ALIGNED_FREE(buffer);
        buffer = 0;
        goto done;
    }
done:
    if (!buffer && size_out) {
        *size_out = 0;
    }
    return buffer;
}